

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O3

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  kiss_fft_cpx kVar6;
  uint uVar7;
  int iVar8;
  kiss_fft_cpx kVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  kiss_fft_cpx *pkVar14;
  long lVar15;
  long lVar16;
  kiss_fft_cpx *pkVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int local_60;
  
  iVar18 = factors[1];
  lVar15 = (long)iVar18;
  uVar7 = *factors;
  if (lVar15 == 1) {
    lVar16 = 0;
    do {
      kVar9 = *f;
      f = f + (long)in_stride * fstride;
      *(kiss_fft_cpx *)((long)&Fout->r + lVar16) = kVar9;
      lVar16 = lVar16 + 8;
    } while ((long)(int)(iVar18 * uVar7) * 8 != lVar16);
  }
  else {
    lVar16 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar16),f,(long)(int)uVar7 * fstride,in_stride,
              factors + 2,st);
      lVar16 = lVar16 + lVar15 * 8;
      f = f + (long)in_stride * fstride;
    } while ((long)(int)(iVar18 * uVar7) * 8 != lVar16);
  }
  auVar35 = _DAT_001de870;
  switch(uVar7) {
  case 2:
    pkVar14 = st->twiddles;
    lVar16 = 0;
    do {
      auVar55._8_8_ = 0;
      auVar55._0_4_ = pkVar14->r;
      auVar55._4_4_ = pkVar14->i;
      pkVar14 = pkVar14 + fstride;
      auVar50._0_4_ = -Fout[lVar15 + lVar16].i;
      auVar50._4_4_ = 0x80000000;
      auVar50._8_4_ = 0x80000000;
      auVar50._12_4_ = 0x80000000;
      auVar36 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 + lVar16].i),auVar35,auVar50);
      auVar37 = vshufps_avx(auVar55,auVar55,0xe1);
      auVar47._0_4_ = auVar37._0_4_ * auVar36._0_4_;
      auVar47._4_4_ = auVar37._4_4_ * auVar36._4_4_;
      auVar47._8_4_ = auVar37._8_4_ * auVar36._8_4_;
      auVar47._12_4_ = auVar37._12_4_ * auVar36._12_4_;
      fVar66 = Fout[lVar15 + lVar16].r;
      auVar13._4_4_ = fVar66;
      auVar13._0_4_ = fVar66;
      auVar13._8_4_ = fVar66;
      auVar13._12_4_ = fVar66;
      auVar36 = vfmadd231ps_avx512vl(auVar47,auVar55,auVar13);
      auVar51._8_8_ = 0;
      auVar51._0_4_ = Fout[lVar16].r;
      auVar51._4_4_ = Fout[lVar16].i;
      auVar37 = vsubps_avx(auVar51,auVar36);
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar37);
      Fout[lVar15 + lVar16] = kVar9;
      auVar48._0_4_ = auVar36._0_4_ + Fout[lVar16].r;
      auVar48._4_4_ = auVar36._4_4_ + Fout[lVar16].i;
      auVar48._8_4_ = auVar36._8_4_ + 0.0;
      auVar48._12_4_ = auVar36._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar48);
      Fout[lVar16] = kVar9;
      lVar16 = lVar16 + 1;
    } while (iVar18 != (int)lVar16);
    break;
  case 3:
    auVar53._8_4_ = 0xbf000000;
    auVar53._0_8_ = 0xbf000000bf000000;
    auVar53._12_4_ = 0xbf000000;
    lVar23 = 0;
    fVar66 = st->twiddles[lVar15 * fstride].i;
    lVar16 = lVar15;
    do {
      auVar75._8_8_ = 0;
      auVar75._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar23);
      auVar62._0_4_ = -Fout[lVar15].i;
      auVar62._4_4_ = 0x80000000;
      auVar62._8_4_ = 0x80000000;
      auVar62._12_4_ = 0x80000000;
      auVar71._0_4_ = -Fout[lVar15 * 2].i;
      auVar71._4_4_ = 0x80000000;
      auVar71._8_4_ = 0x80000000;
      auVar71._12_4_ = 0x80000000;
      auVar36 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15].i),auVar35,auVar62);
      auVar37 = vshufps_avx(auVar75,auVar75,0xe1);
      auVar29 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 2].i),auVar35,auVar71);
      auVar59._0_4_ = auVar37._0_4_ * auVar36._0_4_;
      auVar59._4_4_ = auVar37._4_4_ * auVar36._4_4_;
      auVar59._8_4_ = auVar37._8_4_ * auVar36._8_4_;
      auVar59._12_4_ = auVar37._12_4_ * auVar36._12_4_;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar23 * 2);
      fVar46 = Fout[lVar15].r;
      auVar11._4_4_ = fVar46;
      auVar11._0_4_ = fVar46;
      auVar11._8_4_ = fVar46;
      auVar11._12_4_ = fVar46;
      auVar36 = vfmadd231ps_avx512vl(auVar59,auVar75,auVar11);
      lVar23 = lVar23 + fstride * 8;
      auVar37 = vshufps_avx(auVar63,auVar63,0xe1);
      auVar69._0_4_ = auVar37._0_4_ * auVar29._0_4_;
      auVar69._4_4_ = auVar37._4_4_ * auVar29._4_4_;
      auVar69._8_4_ = auVar37._8_4_ * auVar29._8_4_;
      auVar69._12_4_ = auVar37._12_4_ * auVar29._12_4_;
      fVar46 = Fout[lVar15 * 2].r;
      auVar12._4_4_ = fVar46;
      auVar12._0_4_ = fVar46;
      auVar12._8_4_ = fVar46;
      auVar12._12_4_ = fVar46;
      auVar37 = vfmadd231ps_avx512vl(auVar69,auVar63,auVar12);
      auVar72._8_8_ = 0;
      auVar72._0_4_ = Fout->r;
      auVar72._4_4_ = Fout->i;
      auVar64._0_4_ = auVar36._0_4_ + auVar37._0_4_;
      auVar64._4_4_ = auVar36._4_4_ + auVar37._4_4_;
      auVar64._8_4_ = auVar36._8_4_ + auVar37._8_4_;
      auVar64._12_4_ = auVar36._12_4_ + auVar37._12_4_;
      auVar36 = vsubps_avx(auVar36,auVar37);
      auVar29 = vfmadd231ps_fma(auVar72,auVar64,auVar53);
      auVar37 = vmovshdup_avx(auVar36);
      fVar46 = fVar66 * auVar36._0_4_;
      fVar45 = fVar66 * auVar37._0_4_;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar29);
      Fout[lVar15] = kVar9;
      auVar65._0_4_ = auVar64._0_4_ + (*Fout).r;
      auVar65._4_4_ = auVar64._4_4_ + (*Fout).i;
      auVar65._8_4_ = auVar64._8_4_ + 0.0;
      auVar65._12_4_ = auVar64._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar65);
      *Fout = kVar9;
      Fout[lVar15 * 2].r = fVar45 + Fout[lVar15].r;
      Fout[lVar15 * 2].i = Fout[lVar15].i - fVar46;
      Fout[lVar15].r = Fout[lVar15].r - fVar45;
      Fout[lVar15].i = fVar46 + Fout[lVar15].i;
      Fout = Fout + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
    break;
  case 4:
    iVar18 = st->inverse;
    pkVar17 = st->twiddles;
    lVar16 = 0;
    lVar23 = 0;
    pkVar14 = pkVar17;
    do {
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)((long)&pkVar17->r + lVar23);
      auVar34._0_4_ = -Fout[lVar15 + lVar16].i;
      auVar34._4_4_ = 0x80000000;
      auVar34._8_4_ = 0x80000000;
      auVar34._12_4_ = 0x80000000;
      auVar70._0_4_ = -Fout[lVar15 * 3 + lVar16].i;
      auVar70._4_4_ = 0x80000000;
      auVar70._8_4_ = 0x80000000;
      auVar70._12_4_ = 0x80000000;
      auVar60._0_4_ = -Fout[lVar15 * 2 + lVar16].i;
      auVar60._4_4_ = 0x80000000;
      auVar60._8_4_ = 0x80000000;
      auVar60._12_4_ = 0x80000000;
      auVar36 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 + lVar16].i),auVar35,auVar34);
      auVar37 = vshufps_avx(auVar73,auVar73,0xe1);
      auVar29 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 3 + lVar16].i),auVar35,auVar70);
      auVar32 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar15 * 2 + lVar16].i),auVar35,auVar60);
      auVar33._0_4_ = auVar37._0_4_ * auVar36._0_4_;
      auVar33._4_4_ = auVar37._4_4_ * auVar36._4_4_;
      auVar33._8_4_ = auVar37._8_4_ * auVar36._8_4_;
      auVar33._12_4_ = auVar37._12_4_ * auVar36._12_4_;
      auVar52._8_8_ = 0;
      auVar52._0_4_ = pkVar14->r;
      auVar52._4_4_ = pkVar14->i;
      fVar66 = Fout[lVar15 + lVar16].r;
      auVar27._4_4_ = fVar66;
      auVar27._0_4_ = fVar66;
      auVar27._8_4_ = fVar66;
      auVar27._12_4_ = fVar66;
      auVar36 = vfmadd231ps_avx512vl(auVar33,auVar73,auVar27);
      auVar37 = vshufps_avx(auVar52,auVar52,0xe1);
      auVar67._0_4_ = auVar37._0_4_ * auVar29._0_4_;
      auVar67._4_4_ = auVar37._4_4_ * auVar29._4_4_;
      auVar67._8_4_ = auVar37._8_4_ * auVar29._8_4_;
      auVar67._12_4_ = auVar37._12_4_ * auVar29._12_4_;
      fVar66 = Fout[lVar15 * 3 + lVar16].r;
      auVar30._4_4_ = fVar66;
      auVar30._0_4_ = fVar66;
      auVar30._8_4_ = fVar66;
      auVar30._12_4_ = fVar66;
      auVar37 = vfmadd231ps_avx512vl(auVar67,auVar52,auVar30);
      auVar74._0_4_ = auVar36._0_4_ + auVar37._0_4_;
      auVar74._4_4_ = auVar36._4_4_ + auVar37._4_4_;
      auVar74._8_4_ = auVar36._8_4_ + auVar37._8_4_;
      auVar74._12_4_ = auVar36._12_4_ + auVar37._12_4_;
      auVar29 = vsubps_avx(auVar36,auVar37);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)((long)&pkVar17->r + lVar23 * 2);
      auVar37 = vmovshdup_avx(auVar29);
      auVar36 = vshufps_avx(auVar68,auVar68,0xe1);
      auVar56._0_4_ = auVar36._0_4_ * auVar32._0_4_;
      auVar56._4_4_ = auVar36._4_4_ * auVar32._4_4_;
      auVar56._8_4_ = auVar36._8_4_ * auVar32._8_4_;
      auVar56._12_4_ = auVar36._12_4_ * auVar32._12_4_;
      fVar66 = Fout[lVar15 * 2 + lVar16].r;
      auVar31._4_4_ = fVar66;
      auVar31._0_4_ = fVar66;
      auVar31._8_4_ = fVar66;
      auVar31._12_4_ = fVar66;
      auVar36 = vfmadd231ps_avx512vl(auVar56,auVar68,auVar31);
      kVar9 = Fout[lVar16];
      auVar61._8_8_ = 0;
      auVar61._0_4_ = kVar9.r;
      auVar61._4_4_ = kVar9.i;
      auVar32 = vsubps_avx(auVar61,auVar36);
      auVar57._0_4_ = auVar36._0_4_ + kVar9.r;
      auVar57._4_4_ = auVar36._4_4_ + kVar9.i;
      auVar57._8_4_ = auVar36._8_4_ + 0.0;
      auVar57._12_4_ = auVar36._12_4_ + 0.0;
      Fout[lVar16].r = auVar57._0_4_;
      fVar66 = (float)vextractps_avx(auVar57,1);
      Fout[lVar16].i = fVar66;
      auVar28 = vsubps_avx(auVar57,auVar74);
      auVar36 = vmovshdup_avx(auVar32);
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar28);
      Fout[lVar15 * 2 + lVar16] = kVar9;
      auVar58._0_4_ = auVar74._0_4_ + Fout[lVar16].r;
      auVar58._4_4_ = auVar74._4_4_ + Fout[lVar16].i;
      auVar58._8_4_ = auVar74._8_4_ + 0.0;
      auVar58._12_4_ = auVar74._12_4_ + 0.0;
      kVar9 = (kiss_fft_cpx)vmovlps_avx(auVar58);
      Fout[lVar16] = kVar9;
      fVar66 = auVar32._0_4_;
      fVar45 = auVar29._0_4_;
      fVar49 = auVar37._0_4_;
      fVar46 = auVar36._0_4_;
      if (iVar18 == 0) {
        fVar54 = fVar66 + fVar49;
        fVar1 = fVar46 - fVar45;
        fVar66 = fVar66 - fVar49;
        fVar46 = fVar46 + fVar45;
      }
      else {
        fVar54 = fVar66 - fVar49;
        fVar1 = fVar46 + fVar45;
        fVar66 = fVar66 + fVar49;
        fVar46 = fVar46 - fVar45;
      }
      Fout[lVar15 + lVar16].r = fVar54;
      Fout[lVar15 + lVar16].i = fVar1;
      Fout[lVar15 * 3 + lVar16].r = fVar66;
      Fout[lVar15 * 3 + lVar16].i = fVar46;
      pkVar14 = pkVar14 + fstride * 3;
      lVar23 = lVar23 + fstride * 8;
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
    break;
  case 5:
    if (iVar18 != 0) {
      lVar16 = lVar15 * fstride;
      lVar21 = 0;
      lVar22 = 0;
      lVar24 = 0;
      fVar66 = st->twiddles[lVar16].r;
      fVar46 = st->twiddles[lVar16].i;
      fVar45 = st->twiddles[lVar16 * 2].r;
      fVar49 = st->twiddles[lVar16 * 2].i;
      lVar26 = (long)(iVar18 * 4);
      lVar23 = (long)(iVar18 * 3);
      lVar16 = (long)(iVar18 * 2);
      do {
        fVar1 = *(float *)((long)&st->twiddles[0].i + lVar22 * 2);
        fVar54 = *(float *)((long)&st->twiddles[0].r + lVar22 * 2);
        fVar2 = (&st->twiddles[0].i)[lVar22];
        fVar3 = (&st->twiddles[0].i)[lVar21];
        pkVar14 = st->twiddles + lVar22;
        fVar4 = Fout[lVar24].r;
        fVar5 = Fout[lVar24].i;
        auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * Fout[lVar15 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar15 + lVar24].r),ZEXT416((uint)fVar54));
        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * Fout[lVar15 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar15 + lVar24].r),ZEXT416((uint)fVar1));
        fVar1 = (&st->twiddles[0].r)[lVar22];
        auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar16 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar16 + lVar24].r),ZEXT416((uint)fVar1));
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * Fout[lVar16 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar16 + lVar24].r),ZEXT416((uint)fVar2));
        fVar1 = (&st->twiddles[0].r)[lVar21];
        lVar21 = lVar21 + fstride * 6;
        auVar28 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * Fout[lVar23 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar23 + lVar24].r),ZEXT416((uint)fVar1));
        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * Fout[lVar23 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar23 + lVar24].r),ZEXT416((uint)fVar3));
        fVar1 = st->twiddles[lVar22].r;
        lVar22 = lVar22 + fstride * 4;
        auVar27 = vaddss_avx512f(auVar29,auVar28);
        fVar2 = auVar29._0_4_ - auVar28._0_4_;
        auVar28 = vmulss_avx512f(ZEXT416((uint)fVar49),ZEXT416((uint)fVar2));
        auVar31 = ZEXT416((uint)pkVar14->i);
        auVar29 = vmulss_avx512f(auVar31,ZEXT416((uint)Fout[lVar26 + lVar24].i));
        auVar30 = vfmsub231ss_avx512f(auVar29,ZEXT416((uint)Fout[lVar26 + lVar24].r),
                                      ZEXT416((uint)fVar1));
        auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * Fout[lVar26 + lVar24].i)),
                                  ZEXT416((uint)Fout[lVar26 + lVar24].r),auVar31);
        fVar1 = auVar35._0_4_ + auVar36._0_4_;
        fVar3 = auVar35._0_4_ - auVar36._0_4_;
        auVar31 = vaddss_avx512f(auVar32,auVar30);
        fVar54 = auVar29._0_4_ + auVar37._0_4_;
        auVar30 = vsubss_avx512f(auVar32,auVar30);
        auVar36 = vmulss_avx512f(ZEXT416((uint)fVar49),ZEXT416((uint)fVar3));
        auVar32 = vaddss_avx512f(auVar27,auVar31);
        auVar35 = vfmadd213ss_fma(ZEXT416((uint)fVar66),ZEXT416((uint)fVar54),ZEXT416((uint)fVar5));
        auVar29 = ZEXT416((uint)(auVar37._0_4_ - auVar29._0_4_));
        auVar33 = vfmadd231ss_avx512f(auVar36,auVar29,ZEXT416((uint)fVar46));
        auVar36 = vfnmsub231ss_avx512f(auVar28,auVar30,ZEXT416((uint)fVar46));
        auVar37 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar1),ZEXT416((uint)fVar45));
        Fout[lVar24].r = auVar32._0_4_ + fVar4;
        auVar35 = vfmadd213ss_fma(ZEXT416((uint)fVar54),ZEXT416((uint)fVar45),ZEXT416((uint)fVar5));
        auVar28 = vsubss_avx512f(auVar37,auVar36);
        auVar34 = vaddss_avx512f(auVar37,auVar36);
        auVar36 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar66),ZEXT416((uint)fVar1));
        Fout[lVar24].i = fVar1 + fVar54 + fVar5;
        auVar35 = vfmadd213ss_fma(ZEXT416((uint)fVar66),auVar31,ZEXT416((uint)fVar4));
        auVar37 = vfmadd213ss_fma(auVar31,ZEXT416((uint)fVar45),ZEXT416((uint)fVar4));
        auVar32 = vfnmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar46)),ZEXT416((uint)fVar49),auVar29);
        auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar46)),ZEXT416((uint)fVar49),auVar30);
        auVar35 = vfmadd231ss_avx512f(auVar35,auVar27,ZEXT416((uint)fVar45));
        auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar66),auVar27);
        auVar27 = vsubss_avx512f(auVar35,auVar33);
        auVar35 = vaddss_avx512f(auVar33,auVar35);
        Fout[lVar15 + lVar24].r = auVar27._0_4_;
        Fout[lVar15 + lVar24].i = auVar28._0_4_;
        Fout[lVar26 + lVar24].r = auVar35._0_4_;
        Fout[lVar26 + lVar24].i = auVar34._0_4_;
        Fout[lVar16 + lVar24].r = auVar32._0_4_ + auVar37._0_4_;
        Fout[lVar16 + lVar24].i = auVar36._0_4_ + auVar29._0_4_;
        Fout[lVar23 + lVar24].r = auVar37._0_4_ - auVar32._0_4_;
        Fout[lVar23 + lVar24].i = auVar36._0_4_ - auVar29._0_4_;
        lVar24 = lVar24 + 1;
      } while (lVar15 != lVar24);
    }
    break;
  default:
    iVar8 = st->nfft;
    pkVar14 = (kiss_fft_cpx *)malloc((long)(int)uVar7 * 8);
    auVar35 = _DAT_001de870;
    if (0 < iVar18) {
      auVar38 = vpbroadcastq_avx512f();
      auVar38 = vpmuludq_avx512f(auVar38,_DAT_001de880);
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar16 = 0;
      auVar40 = vpbroadcastq_avx512f();
      auVar41 = vpbroadcastq_avx512f();
      do {
        if (0 < (int)uVar7) {
          auVar42 = vpbroadcastq_avx512f();
          uVar19 = 0;
          auVar42 = vpaddq_avx512f(auVar42,auVar38);
          do {
            auVar43 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar43,auVar39);
            uVar10 = vpcmpuq_avx512f(auVar43,auVar41,2);
            auVar43 = vpgatherqq_avx512f(*Fout);
            auVar44._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * auVar43._8_8_;
            auVar44._0_8_ = (ulong)((byte)uVar10 & 1) * auVar43._0_8_;
            auVar44._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * auVar43._16_8_;
            auVar44._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * auVar43._24_8_;
            auVar44._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * auVar43._32_8_;
            auVar44._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * auVar43._40_8_;
            auVar44._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * auVar43._48_8_;
            auVar44._56_8_ = (uVar10 >> 7) * auVar43._56_8_;
            auVar42 = vpaddq_avx512f(auVar42,auVar40);
            auVar43 = vmovdqu64_avx512f(auVar44);
            *(undefined1 (*) [64])(pkVar14 + uVar19) = auVar43;
            uVar19 = uVar19 + 8;
          } while ((uVar7 + 7 & 0xfffffff8) != uVar19);
          kVar9 = *pkVar14;
          uVar20 = 0;
          lVar23 = lVar16;
          do {
            Fout[lVar23] = kVar9;
            if (1 < (int)uVar7) {
              local_60 = (int)fstride;
              lVar26 = 0;
              iVar18 = 0;
              auVar42 = ZEXT864((ulong)kVar9);
              do {
                iVar18 = iVar18 + (int)lVar23 * local_60;
                iVar25 = iVar8;
                if (iVar18 < iVar8) {
                  iVar25 = 0;
                }
                iVar18 = iVar18 - iVar25;
                auVar28._8_8_ = 0;
                auVar28._0_4_ = st->twiddles[iVar18].r;
                auVar28._4_4_ = st->twiddles[iVar18].i;
                auVar32._0_4_ = -pkVar14[lVar26 + 1].i;
                auVar32._4_4_ = 0x80000000;
                auVar32._8_4_ = 0x80000000;
                auVar32._12_4_ = 0x80000000;
                auVar36 = vpermt2ps_avx512vl(ZEXT416((uint)pkVar14[lVar26 + 1].i),auVar35,auVar32);
                auVar37 = vshufps_avx(auVar28,auVar28,0xe1);
                auVar29._0_4_ = auVar37._0_4_ * auVar36._0_4_;
                auVar29._4_4_ = auVar37._4_4_ * auVar36._4_4_;
                auVar29._8_4_ = auVar37._8_4_ * auVar36._8_4_;
                auVar29._12_4_ = auVar37._12_4_ * auVar36._12_4_;
                fVar66 = pkVar14[lVar26 + 1].r;
                auVar37._4_4_ = fVar66;
                auVar37._0_4_ = fVar66;
                auVar37._8_4_ = fVar66;
                auVar37._12_4_ = fVar66;
                auVar37 = vfmadd231ps_avx512vl(auVar29,auVar28,auVar37);
                lVar26 = lVar26 + 1;
                auVar36._0_4_ = auVar37._0_4_ + auVar42._0_4_;
                auVar36._4_4_ = auVar37._4_4_ + auVar42._4_4_;
                auVar36._8_4_ = auVar37._8_4_ + auVar42._8_4_;
                auVar36._12_4_ = auVar37._12_4_ + auVar42._12_4_;
                auVar42 = ZEXT1664(auVar36);
                kVar6 = (kiss_fft_cpx)vmovlps_avx(auVar36);
                Fout[lVar23] = kVar6;
              } while ((ulong)uVar7 - 1 != lVar26);
            }
            uVar20 = uVar20 + 1;
            lVar23 = lVar23 + lVar15;
          } while (uVar20 != uVar7);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar15);
    }
    free(pkVar14);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    /*
    use openmp extensions at the 
    top-level (not recursive)
    */
    if (fstride==1 && p<=5)
    {
        int k;

        /* execute the p different work units in different threads */
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        /* all threads have joined by this point */

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            /*
            recursive call:
            DFT of size m*p performed by doing
            p instances of smaller DFTs of size m, 
            each one takes a decimated version of the input
            */
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    /* recombine the p smaller DFTs */
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}